

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O0

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
cmCommandLineArgument<cmake::SetArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__22>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *n,Values t,
          anon_class_1_0_00000001 *func)

{
  cmAlphaNum local_f8;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  anon_class_1_0_00000001 *local_28;
  anon_class_1_0_00000001 *func_local;
  string *psStack_18;
  Values t_local;
  string *n_local;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  *this_local;
  
  local_28 = func;
  func_local._4_4_ = t;
  psStack_18 = n;
  n_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_58," is invalid syntax for ");
  cmAlphaNum::cmAlphaNum(&local_88,n);
  cmStrCat<>((string *)this,&local_58,&local_88);
  cmAlphaNum::cmAlphaNum(&local_b8,"Invalid value used with ");
  cmAlphaNum::cmAlphaNum(&local_f8,n);
  cmStrCat<>((string *)(this + 0x20),&local_b8,&local_f8);
  std::__cxx11::string::string((string *)(this + 0x40),(string *)n);
  *(Values *)(this + 0x60) = func_local._4_4_;
  *(undefined4 *)(this + 100) = 0;
  std::function<bool(std::__cxx11::string_const&,cmake*)>::
  function<cmake::SetArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__22,void>
            ((function<bool(std::__cxx11::string_const&,cmake*)> *)(this + 0x68),local_28);
  return;
}

Assistant:

cmCommandLineArgument(std::string n, Values t, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(cmStrCat("Invalid value used with ", n))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(RequiresSeparator::Yes)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }